

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RU_matrix.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>
::RU_matrix(RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>
            *this,RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>
                  *matrixToCopy,Column_settings *colSettings)

{
  Field_operators *local_58;
  Column_settings *colSettings_local;
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>
  *matrixToCopy_local;
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>
  *this_local;
  
  RU_pairing<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>
  ::RU_pairing(&this->super_RU_pairing_option,&matrixToCopy->super_RU_pairing_option);
  RU_representative_cycles<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>
  ::RU_representative_cycles
            (&this->super_RU_representative_cycles_option,
             &matrixToCopy->super_RU_representative_cycles_option);
  Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>
  ::Boundary_matrix(&this->reducedMatrixR_,&matrixToCopy->reducedMatrixR_,colSettings);
  Base_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>
  ::Base_matrix(&this->mirrorMatrixU_,&matrixToCopy->mirrorMatrixU_,colSettings);
  std::
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::unordered_map(&this->pivotToColumnIndex_,&matrixToCopy->pivotToColumnIndex_);
  this->nextEventIndex_ = matrixToCopy->nextEventIndex_;
  if (colSettings == (Column_settings *)0x0) {
    local_58 = matrixToCopy->operators_;
  }
  else {
    local_58 = (Field_operators *)0x0;
  }
  this->operators_ = local_58;
  if (colSettings != (Column_settings *)0x0) {
    this->operators_ = &colSettings->operators;
  }
  return;
}

Assistant:

inline RU_matrix<Master_matrix>::RU_matrix(const RU_matrix& matrixToCopy, Column_settings* colSettings)
    : Pair_opt(static_cast<const Pair_opt&>(matrixToCopy)),
      Swap_opt(static_cast<const Swap_opt&>(matrixToCopy)),
      Rep_opt(static_cast<const Rep_opt&>(matrixToCopy)),
      reducedMatrixR_(matrixToCopy.reducedMatrixR_, colSettings),
      mirrorMatrixU_(matrixToCopy.mirrorMatrixU_, colSettings),
      pivotToColumnIndex_(matrixToCopy.pivotToColumnIndex_),
      nextEventIndex_(matrixToCopy.nextEventIndex_),
      operators_(colSettings == nullptr ? matrixToCopy.operators_ : nullptr)
{
  if constexpr (!Master_matrix::Option_list::is_z2) {
    if (colSettings != nullptr) operators_ = &(colSettings->operators);
  }
}